

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::StreamingListener::OnTestPartResult
          (StreamingListener *this,TestPartResult *test_part_result)

{
  StreamingListener *pSVar1;
  char *in_RDX;
  char *str;
  StreamingListener *this_00;
  string local_70;
  string local_50;
  String local_30;
  
  pSVar1 = (StreamingListener *)(test_part_result->file_name_).c_str_;
  this_00 = (StreamingListener *)0x1381b4;
  if (pSVar1 != (StreamingListener *)0x0) {
    this_00 = pSVar1;
  }
  UrlEncode_abi_cxx11_(&local_70,this_00,in_RDX);
  String::Format(&local_30,"event=TestPartResult&file=%s&line=%d&message=",local_70._M_dataplus._M_p
                 ,(ulong)(uint)test_part_result->line_number_);
  String::operator_cast_to_string(&local_50,&local_30);
  Send(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  String::~String(&local_30);
  std::__cxx11::string::~string((string *)&local_70);
  UrlEncode_abi_cxx11_(&local_70,(StreamingListener *)(test_part_result->message_).c_str_,str);
  std::operator+(&local_50,&local_70,"\n");
  Send(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void OnTestPartResult(const TestPartResult& test_part_result) {
    const char* file_name = test_part_result.file_name();
    if (file_name == NULL)
      file_name = "";
    Send(String::Format("event=TestPartResult&file=%s&line=%d&message=",
                        UrlEncode(file_name).c_str(),
                        test_part_result.line_number()));
    Send(UrlEncode(test_part_result.message()) + "\n");
  }